

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InterpolateAtOffsetCase::genVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  uint uVar1;
  ostream *poVar2;
  bool *pbVar3;
  char *pcVar4;
  bool *pbVar5;
  ContextType local_1b4;
  string local_1b0;
  ostringstream buf;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  poVar2 = std::operator<<((ostream *)&buf,"${GLSL_VERSION_DECL}\n");
  poVar2 = std::operator<<(poVar2,"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}");
  std::operator<<(poVar2,"in highp vec4 a_position;\n");
  uVar1 = *(uint *)((long)this + 0x128);
  if (uVar1 < 3) {
    pbVar3 = glcts::fixed_sample_locations_values + 1;
    if (uVar1 == 2) {
      pbVar3 = (bool *)0x18b8194;
    }
    pbVar5 = (bool *)"centroid ";
    if (uVar1 != 1) {
      pbVar5 = pbVar3;
    }
    poVar2 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,pbVar5);
    poVar2 = std::operator<<(poVar2,"out highp vec2 v_screenPosition;\n");
    poVar2 = std::operator<<(poVar2,pbVar5);
    std::operator<<(poVar2,"out highp vec2 v_offset;\n");
  }
  else if (uVar1 == 3) {
    poVar2 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                             "out highp vec2[2] v_screenPosition;\n");
    std::operator<<(poVar2,"out highp vec2 v_offset;\n");
  }
  poVar2 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                           "void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  std::operator<<(poVar2,"\tgl_Position = a_position;\n");
  pcVar4 = "\tv_screenPosition = (a_position.xy + vec2(1.0, 1.0)) / 2.0 * vec2(";
  if (*(int *)((long)this + 0x128) == 3) {
    pcVar4 = 
    "\tv_screenPosition[0] = a_position.xy; // not used\n\tv_screenPosition[1] = (a_position.xy + vec2(1.0, 1.0)) / 2.0 * vec2("
    ;
  }
  poVar2 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,pcVar4);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x20);
  poVar2 = std::operator<<(poVar2,".0, ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x20);
  std::operator<<(poVar2,".0);\n");
  poVar2 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                           "\tv_offset = a_position.xy * 0.5f;\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::stringbuf::str();
  local_1b4.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)((long)this + 0x70) + 8) + 0x10))();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_1b0,&local_1b4);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  return __return_storage_ptr__;
}

Assistant:

std::string InterpolateAtOffsetCase::genVertexSource (int numTargetSamples) const
{
	DE_UNREF(numTargetSamples);

	std::ostringstream buf;
	buf << "${GLSL_VERSION_DECL}\n"
		<< "${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}"
		<< "in highp vec4 a_position;\n";

	if (m_testType == TEST_QUALIFIER_NONE || m_testType == TEST_QUALIFIER_CENTROID || m_testType == TEST_QUALIFIER_SAMPLE)
	{
		const char* const qualifier = (m_testType == TEST_QUALIFIER_CENTROID) ? ("centroid ") : (m_testType == TEST_QUALIFIER_SAMPLE) ? ("sample ") : ("");
		buf << qualifier << "out highp vec2 v_screenPosition;\n"
			<< qualifier << "out highp vec2 v_offset;\n";
	}
	else if (m_testType == TEST_ARRAY_ELEMENT)
	{
		buf << "out highp vec2[2] v_screenPosition;\n"
			<< "out highp vec2 v_offset;\n";
	}
	else
		DE_ASSERT(false);

	buf	<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position = a_position;\n";

	if (m_testType != TEST_ARRAY_ELEMENT)
		buf	<< "	v_screenPosition = (a_position.xy + vec2(1.0, 1.0)) / 2.0 * vec2(" << (int)RENDER_SIZE << ".0, " << (int)RENDER_SIZE << ".0);\n";
	else
		buf	<< "	v_screenPosition[0] = a_position.xy; // not used\n"
				"	v_screenPosition[1] = (a_position.xy + vec2(1.0, 1.0)) / 2.0 * vec2(" << (int)RENDER_SIZE << ".0, " << (int)RENDER_SIZE << ".0);\n";

	buf	<< "	v_offset = a_position.xy * 0.5f;\n"
		<< "}\n";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}